

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

int Abc_NtkRenodeEvalSop(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  char *pcVar2;
  uint *puTruth;
  int local_2c;
  int RetValue;
  int i;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar2 = If_CutPerm(pCut);
  local_2c = 0;
  while( true ) {
    iVar1 = If_CutLeaveNum(pCut);
    if (iVar1 <= local_2c) break;
    pcVar2[local_2c] = '\x01';
    local_2c = local_2c + 1;
  }
  puTruth = If_CutTruth(p,pCut);
  iVar1 = If_CutLeaveNum(pCut);
  iVar1 = Kit_TruthIsop(puTruth,iVar1,s_vMemory,1);
  if (iVar1 == -1) {
    p_local._4_4_ = 0xfff;
  }
  else {
    if ((iVar1 != 0) && (iVar1 != 1)) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0xee,"int Abc_NtkRenodeEvalSop(If_Man_t *, If_Cut_t *)");
    }
    p_local._4_4_ = Vec_IntSize(s_vMemory);
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkRenodeEvalSop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 1 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    return Vec_IntSize( s_vMemory );
}